

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O0

void load1(char *filename)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  byte local_30d;
  Am_Value_List local_2f0 [23];
  byte local_2d9;
  Am_Value_List local_2d8 [23];
  byte local_2c1;
  Am_String local_2c0 [15];
  byte local_2b1;
  Am_String local_2b0 [8];
  Am_Value local_2a8;
  Am_Value_List local_298 [8];
  Am_Value_List l4;
  Am_Value local_288;
  Am_Value_List local_278 [8];
  Am_Value_List l3;
  Am_Value local_268;
  Am_Value_List local_258 [8];
  Am_Value_List l2;
  Am_Value local_248;
  Am_Value_List local_238 [8];
  Am_Value_List l1;
  long local_218;
  ifstream in_file;
  char *filename_local;
  
  std::ifstream::ifstream(&local_218,filename,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar2 & 1) == 0) {
    Am_Load_Save_Context::Reset();
    Am_Load_Save_Context::Load((istream *)&local_248);
    Am_Value_List::Am_Value_List(local_238,(Am_Value *)&local_248);
    Am_Value::~Am_Value(&local_248);
    Am_Load_Save_Context::Load((istream *)&local_268);
    Am_Value_List::Am_Value_List(local_258,(Am_Value *)&local_268);
    Am_Value::~Am_Value(&local_268);
    Am_Load_Save_Context::Load((istream *)&local_288);
    Am_Value_List::Am_Value_List(local_278,(Am_Value *)&local_288);
    Am_Value::~Am_Value(&local_288);
    Am_Load_Save_Context::Load((istream *)&local_2a8);
    Am_Value_List::Am_Value_List(local_298,(Am_Value *)&local_2a8);
    Am_Value::~Am_Value(&local_2a8);
    local_2b1 = 0;
    local_2c1 = 0;
    local_2d9 = 0;
    bVar1 = false;
    pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)local_238);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    local_30d = 0;
    if (iVar3 == 5) {
      pAVar5 = (Am_Value *)Am_Value_List::Get_Nth((int)local_238);
      Am_String::Am_String(local_2b0,pAVar5);
      local_2b1 = 1;
      bVar2 = Am_String::operator==(local_2b0,"hello");
      local_30d = 0;
      if ((bVar2 & 1) != 0) {
        pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)local_238);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        local_30d = 0;
        if (iVar3 == 10) {
          bVar2 = Am_Value_List::operator==(local_238,local_258);
          local_30d = 0;
          if ((bVar2 & 1) != 0) {
            pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)local_278);
            iVar3 = Am_Value::operator_cast_to_int(pAVar4);
            local_30d = 0;
            if (iVar3 == 5) {
              pAVar5 = (Am_Value *)Am_Value_List::Get_Nth((int)local_278);
              Am_String::Am_String(local_2c0,pAVar5);
              local_2c1 = 1;
              bVar2 = Am_String::operator==(local_2c0,"hello");
              local_30d = 0;
              if ((bVar2 & 1) != 0) {
                pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)local_278);
                iVar3 = Am_Value::operator_cast_to_int(pAVar4);
                local_30d = 0;
                if (iVar3 == 10) {
                  pAVar5 = (Am_Value *)Am_Value_List::Get_Nth((int)local_278);
                  Am_Value_List::Am_Value_List(local_2d8,pAVar5);
                  local_2d9 = 1;
                  bVar2 = Am_Value_List::operator==(local_2d8,local_238);
                  local_30d = 0;
                  if ((bVar2 & 1) != 0) {
                    pAVar5 = (Am_Value *)Am_Value_List::Get_Nth((int)local_278);
                    Am_Value_List::Am_Value_List(local_2f0,pAVar5);
                    bVar1 = true;
                    bVar2 = Am_Value_List::operator==(local_2f0,local_258);
                    local_30d = 0;
                    if ((bVar2 & 1) != 0) {
                      local_30d = Am_Value_List::operator==
                                            (local_298,(Am_Value_List *)&Am_No_Value_List);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (bVar1) {
      Am_Value_List::~Am_Value_List(local_2f0);
    }
    if ((local_2d9 & 1) != 0) {
      Am_Value_List::~Am_Value_List(local_2d8);
    }
    if ((local_2c1 & 1) != 0) {
      Am_String::~Am_String(local_2c0);
    }
    if ((local_2b1 & 1) != 0) {
      Am_String::~Am_String(local_2b0);
    }
    if ((local_30d & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Test 1 failed");
      std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"Test 1 okay");
      std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
    }
    Am_Value_List::~Am_Value_List(local_298);
    Am_Value_List::~Am_Value_List(local_278);
    Am_Value_List::~Am_Value_List(local_258);
    Am_Value_List::~Am_Value_List(local_238);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"open failed");
    std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::ifstream::~ifstream(&local_218);
  return;
}

Assistant:

void
load1(const char *filename)
{
  // open input-file
  std::ifstream in_file(filename, std::ios::in);
  if (!in_file) {
    std::cout << "open failed" << std::endl;
    return;
  }

  // reset internal reference counters etc. (should always be done for new stream)
  Am_Default_Load_Save_Context.Reset();

  // read-in the different Am_Value_List objects
  Am_Value_List l1 = Am_Default_Load_Save_Context.Load(in_file);
  Am_Value_List l2 = Am_Default_Load_Save_Context.Load(in_file);
  Am_Value_List l3 = Am_Default_Load_Save_Context.Load(in_file);
  Am_Value_List l4 = Am_Default_Load_Save_Context.Load(in_file);

  if ((int)l1.Get_Nth(0) == 5 && Am_String(l1.Get_Nth(1)) == "hello" &&
      (int)l1.Get_Nth(2) == 10 && l1 == l2 && (int)l3.Get_Nth(0) == 5 &&
      Am_String(l3.Get_Nth(1)) == "hello" && (int)l3.Get_Nth(2) == 10 &&
      Am_Value_List(l3.Get_Nth(3)) == l1 &&
      Am_Value_List(l3.Get_Nth(4)) == l2 && l4 == Am_No_Value_List) {
    std::cout << "Test 1 okay" << std::endl;
  } else {
    std::cout << "Test 1 failed" << std::endl;
  }

  return;
}